

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ms.c
# Opt level: O3

void bp_update_ms(mod2sparse *H,char *synd,double *log_prob_ratios,int iter,char *decoding)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  double dVar4;
  uint uVar5;
  mod2entry *pmVar6;
  mod2entry *pmVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar1 = H->n_rows;
  uVar2 = H->n_cols;
  dVar10 = exp2(-(double)(iter + 1));
  if (0 < (long)iVar1) {
    dVar12 = 1.0 - dVar10;
    lVar8 = 0;
    do {
      uVar5 = (uint)(synd[lVar8] == '\x01');
      pmVar6 = H->rows[lVar8].right;
      if (pmVar6->row < 0) {
        dVar13 = 1e+308;
        dVar14 = 1e+308;
      }
      else {
        dVar14 = 1e+308;
        dVar11 = 1e+308;
        do {
          dVar13 = ABS(pmVar6->pr);
          dVar4 = dVar11;
          if ((dVar11 <= dVar13) &&
             (bVar3 = dVar14 <= dVar13, dVar4 = dVar13, dVar13 = dVar11, bVar3)) {
            dVar4 = dVar14;
          }
          dVar14 = dVar4;
          uVar5 = (uVar5 + 1) - (uint)(0.0 < pmVar6->pr);
          pmVar6 = pmVar6->right;
          dVar11 = dVar13;
        } while (-1 < pmVar6->row);
      }
      pmVar6 = H->rows[lVar8].left;
      if (-1 < pmVar6->row) {
        do {
          uVar9 = -(ulong)(0.0 < pmVar6->pr);
          dVar10 = pow(-1.0,(double)(~uVar9 & (ulong)dVar10 | uVar9 & 0x8000000000000000) +
                            (double)(int)uVar5);
          uVar9 = -(ulong)(ABS(pmVar6->pr) == dVar13);
          pmVar6->lr = (double)(~uVar9 & (ulong)dVar13 | uVar9 & (ulong)dVar14) * dVar10 * dVar12;
          pmVar6 = pmVar6->left;
        } while (-1 < pmVar6->row);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  if (0 < (int)uVar2) {
    pmVar6 = H->cols;
    uVar9 = 0;
    do {
      dVar10 = log_prob_ratio_initial;
      for (pmVar6 = pmVar6[uVar9].down; -1 < pmVar6->row; pmVar6 = pmVar6->down) {
        dVar10 = dVar10 + pmVar6->lr;
      }
      log_prob_ratios[uVar9] = dVar10;
      decoding[uVar9] = dVar10 <= 0.0;
      pmVar6 = H->cols;
      for (pmVar7 = pmVar6[uVar9].up; -1 < pmVar7->row; pmVar7 = pmVar7->up) {
        pmVar7->pr = dVar10 - pmVar7->lr;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar2);
  }
  return;
}

Assistant:

void bp_update_ms(mod2sparse *H,
    char *synd,
    double *log_prob_ratios,
    int iter,
    char *decoding)
    {

  double pr, dR,nX,dX;
  mod2entry *e;
  int N, M;
  int i, j;
  double sgn;
  int mod2row_weight;
  int synd_sgn;
  double min1, min2;
  double alpha;


  M = mod2sparse_rows(H);
  N = mod2sparse_cols(H);

  char *temp_synd;
  char *temp_dec;

  //scaling factor
  iter++;
  alpha=1.0 - pow(2.0,  (-1*(double) iter)/1  );


  //Recompute likelihood ratios.
  for (i = 0; i<M; i++)
  { 
    
    mod2row_weight=0;
    if(synd[i]==0)
      { 
        mod2row_weight=0;
      }
    else if(synd[i]==1)
      { 
        mod2row_weight=1;
      }

    min1=1e308;
    min2=1e308;

    for (e = mod2sparse_first_in_row(H,i);
         !mod2sparse_at_end(e);
         e = mod2sparse_next_in_row(e))
      { 
        if (fabs(e->pr) < min1)
            {
                min2=min1;
                min1=fabs(e->pr);
            }
        else if(fabs(e->pr) < min2)
            {
                min2=fabs(e->pr);
            }
        
        if(e->pr <= 0) mod2row_weight++;
      }

    for (e = mod2sparse_last_in_row(H,i);
         !mod2sparse_at_end(e);
         e = mod2sparse_prev_in_row(e))
      {
        if(e->pr <= 0) sgn=sgn+ mod2row_weight;
        else sgn=mod2row_weight;

        sgn=pow(-1,sgn);
        if (fabs(e->pr)==min1) e->lr=alpha*sgn*min2;
        else e->lr=alpha*sgn*min1;

      }

  }

  //Recompute log-probability-ratios for the bits
  for (j = 0; j<N; j++)
    { 
      pr = log_prob_ratio_initial;
      for (e = mod2sparse_first_in_col(H,j);
          !mod2sparse_at_end(e);
          e = mod2sparse_next_in_col(e))
        {
          pr+=e->lr;
        }
      log_prob_ratios[j]=pr;

      decoding[j] = pr<=0;

      for (e = mod2sparse_last_in_col(H,j);
          !mod2sparse_at_end(e);
          e = mod2sparse_prev_in_col(e))
        {
          e->pr = pr-(e->lr);

        }
    }

}